

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

Float pbrt::SphericalQuadArea(Vector3f *a,Vector3f *b,Vector3f *c,Vector3f *d)

{
  int __x;
  float fVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar18 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 extraout_var [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar15 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar16 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar17 [64];
  Vector3<float> VVar19;
  Float delta;
  Float gamma;
  Float beta;
  Float alpha;
  Vector3f dxa;
  Vector3f cxd;
  Vector3f bxc;
  Vector3f axb;
  Tuple3<pbrt::Vector3,_float> *this;
  Vector3<float> *in_stack_fffffffffffffe48;
  Vector3<float> *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  Vector3<float> *in_stack_fffffffffffffe78;
  Vector3<float> *v1;
  Tuple3<pbrt::Vector3,_float> local_98;
  Tuple3<pbrt::Vector3,_float> local_88;
  Tuple3<pbrt::Vector3,_float> local_78;
  Tuple3<pbrt::Vector3,_float> local_68;
  Tuple3<pbrt::Vector3,_float> local_58;
  Tuple3<pbrt::Vector3,_float> local_48;
  Tuple3<pbrt::Vector3,_float> local_38 [4];
  
  auVar18 = in_ZMM0._8_56_;
  VVar19 = Cross<float>(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_48.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar6._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar6._8_56_ = auVar18;
  local_48._0_8_ = vmovlpd_avx(auVar6._0_16_);
  local_38[0]._0_8_ = local_48._0_8_;
  local_38[0].z = local_48.z;
  VVar19 = Cross<float>(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_68.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar7._8_56_ = auVar18;
  local_68._0_8_ = vmovlpd_avx(auVar7._0_16_);
  local_58._0_8_ = local_68._0_8_;
  local_58.z = local_68.z;
  VVar19 = Cross<float>(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_88.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar8._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar18;
  local_88._0_8_ = vmovlpd_avx(auVar8._0_16_);
  local_78._0_8_ = local_88._0_8_;
  local_78.z = local_88.z;
  VVar19 = Cross<float>(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  local_98.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar9._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar18;
  local_98._0_8_ = vmovlpd_avx(auVar9._0_16_);
  fVar1 = LengthSquared<float>((Vector3<float> *)local_38);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = LengthSquared<float>((Vector3<float> *)&local_58);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      fVar1 = LengthSquared<float>((Vector3<float> *)&local_78);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        fVar1 = LengthSquared<float>((Vector3<float> *)&local_98);
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          auVar18 = extraout_var;
          VVar19 = Normalize<float>((Vector3<float> *)
                                    CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          local_38[0].z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar10._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar10._8_56_ = auVar18;
          local_38[0]._0_8_ = vmovlpd_avx(auVar10._0_16_);
          VVar19 = Normalize<float>((Vector3<float> *)
                                    CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          local_58.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar11._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar11._8_56_ = auVar18;
          local_58._0_8_ = vmovlpd_avx(auVar11._0_16_);
          this = &local_78;
          VVar19 = Normalize<float>((Vector3<float> *)
                                    CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          local_78.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar12._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar12._8_56_ = auVar18;
          local_78._0_8_ = vmovlpd_avx(auVar12._0_16_);
          VVar19 = Normalize<float>((Vector3<float> *)
                                    CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          local_98.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar13._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar13._8_56_ = auVar18;
          local_98._0_8_ = vmovlpd_avx(auVar13._0_16_);
          VVar19 = Tuple3<pbrt::Vector3,_float>::operator-(this);
          auVar14._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar14._8_56_ = auVar18;
          vmovlpd_avx(auVar14._0_16_);
          FVar2 = AngleBetween<float>(in_stack_fffffffffffffe78,
                                      (Vector3<float> *)
                                      CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))
          ;
          auVar18 = extraout_var_00;
          VVar19 = Tuple3<pbrt::Vector3,_float>::operator-(this);
          auVar15._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar15._8_56_ = auVar18;
          vmovlpd_avx(auVar15._0_16_);
          FVar3 = AngleBetween<float>(in_stack_fffffffffffffe78,
                                      (Vector3<float> *)
                                      CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70))
          ;
          auVar18 = extraout_var_01;
          VVar19 = Tuple3<pbrt::Vector3,_float>::operator-(this);
          auVar16._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar16._8_56_ = auVar18;
          v1 = (Vector3<float> *)vmovlpd_avx(auVar16._0_16_);
          FVar4 = AngleBetween<float>(v1,(Vector3<float> *)
                                         CONCAT44(in_stack_fffffffffffffe74,
                                                  in_stack_fffffffffffffe70));
          auVar18 = extraout_var_02;
          VVar19 = Tuple3<pbrt::Vector3,_float>::operator-(this);
          auVar17._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar17._8_56_ = auVar18;
          vmovlpd_avx(auVar17._0_16_);
          __x = (int)&local_78;
          FVar5 = AngleBetween<float>(v1,(Vector3<float> *)
                                         CONCAT44(in_stack_fffffffffffffe74,
                                                  VVar19.super_Tuple3<pbrt::Vector3,_float>.z));
          fVar1 = (FVar2 + FVar3 + FVar4 + FVar5) - 6.2831855;
          std::abs(__x);
          return fVar1;
        }
      }
    }
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU
inline Float SphericalQuadArea(const Vector3f &a, const Vector3f &b, const Vector3f &c,
                               const Vector3f &d) {
    Vector3f axb = Cross(a, b), bxc = Cross(b, c);
    Vector3f cxd = Cross(c, d), dxa = Cross(d, a);
    if (LengthSquared(axb) == 0 || LengthSquared(bxc) == 0 || LengthSquared(cxd) == 0 ||
        LengthSquared(dxa) == 0)
        return 0;
    axb = Normalize(axb);
    bxc = Normalize(bxc);
    cxd = Normalize(cxd);
    dxa = Normalize(dxa);

    Float alpha = AngleBetween(dxa, -axb);
    Float beta = AngleBetween(axb, -bxc);
    Float gamma = AngleBetween(bxc, -cxd);
    Float delta = AngleBetween(cxd, -dxa);

    return std::abs(alpha + beta + gamma + delta - 2 * Pi);
}